

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p.c
# Opt level: O1

int envy_bios_parse_p_falcon_ucode(envy_bios *bios)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  envy_bios_p_falcon_ucode_entry *peVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar2 = (bios->p).falcon_ucode.offset;
  iVar17 = -0x16;
  if (uVar2 != 0) {
    if ((uint)uVar2 < bios->length) {
      (bios->p).falcon_ucode.version = bios->data[(uint)uVar2];
    }
    else {
      (bios->p).falcon_ucode.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->p).falcon_ucode.version == '\x01') {
      lVar8 = (ulong)(bios->p).falcon_ucode.offset + 1;
      if ((uint)lVar8 < bios->length) {
        (bios->p).falcon_ucode.hlen = bios->data[lVar8];
        iVar17 = 0;
      }
      else {
        (bios->p).falcon_ucode.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar17 = -0xe;
      }
      lVar8 = (ulong)(bios->p).falcon_ucode.offset + 2;
      if ((uint)lVar8 < bios->length) {
        (bios->p).falcon_ucode.rlen = bios->data[lVar8];
        iVar10 = 0;
      }
      else {
        (bios->p).falcon_ucode.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar10 = -0xe;
      }
      lVar8 = (ulong)(bios->p).falcon_ucode.offset + 3;
      if ((uint)lVar8 < bios->length) {
        (bios->p).falcon_ucode.entriesnum = bios->data[lVar8];
        iVar4 = 0;
      }
      else {
        (bios->p).falcon_ucode.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar4 = -0xe;
      }
      lVar8 = (ulong)(bios->p).falcon_ucode.offset + 4;
      if ((uint)lVar8 < bios->length) {
        (bios->p).falcon_ucode.desc_version = bios->data[lVar8];
        iVar5 = 0;
      }
      else {
        (bios->p).falcon_ucode.desc_version = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar5 = -0xe;
      }
      lVar8 = (ulong)(bios->p).falcon_ucode.offset + 5;
      if ((uint)lVar8 < bios->length) {
        (bios->p).falcon_ucode.desc_size = bios->data[lVar8];
        iVar6 = 0;
      }
      else {
        (bios->p).falcon_ucode.desc_size = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar6 = -0xe;
      }
      (bios->p).falcon_ucode.valid =
           (((iVar10 == 0 && iVar17 == 0) && iVar4 == 0) && iVar5 == 0) && iVar6 == 0;
      bVar1 = (bios->p).falcon_ucode.entriesnum;
      peVar7 = (envy_bios_p_falcon_ucode_entry *)malloc((ulong)bVar1 << 6);
      (bios->p).falcon_ucode.entries = peVar7;
      if (bVar1 != 0) {
        lVar8 = 0;
        uVar11 = 0;
        uVar19 = 0;
        do {
          uVar14 = (ulong)((uint)(bios->p).falcon_ucode.rlen * (int)uVar11) +
                   (ulong)((uint)(bios->p).falcon_ucode.hlen + (uint)(bios->p).falcon_ucode.offset);
          peVar7 = (bios->p).falcon_ucode.entries;
          *(short *)((long)&peVar7->offset + lVar8) = (short)uVar14;
          uVar13 = (uint)uVar14;
          if (uVar13 < bios->length) {
            (&peVar7->application_id)[lVar8] = bios->data[uVar14];
            uVar18 = 0;
          }
          else {
            (&peVar7->application_id)[lVar8] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n",uVar14 & 0xffffffff);
            uVar18 = 0xfffffff2;
          }
          lVar9 = (uVar14 & 0xffffffff) + 1;
          peVar7 = (bios->p).falcon_ucode.entries;
          if ((uint)lVar9 < bios->length) {
            (&peVar7->target_id)[lVar8] = bios->data[lVar9];
            uVar15 = 0;
          }
          else {
            (&peVar7->target_id)[lVar8] = '\0';
            fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
            uVar15 = 0xfffffff2;
          }
          peVar7 = (bios->p).falcon_ucode.entries;
          if (uVar13 + 5 < bios->length) {
            *(undefined4 *)((long)&peVar7->desc_ptr + lVar8) =
                 *(undefined4 *)(bios->data + uVar14 + 2);
            uVar13 = 0;
          }
          else {
            *(undefined4 *)((long)&peVar7->desc_ptr + lVar8) = 0;
            fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)(uVar13 + 2));
            uVar13 = 0xfffffff2;
          }
          uVar19 = uVar18 | uVar19 | uVar15 | uVar13;
          peVar7 = (bios->p).falcon_ucode.entries;
          uVar13 = *(uint *)((long)&peVar7->desc_ptr + lVar8);
          if ((ulong)uVar13 != 0) {
            *(uint *)((long)&(peVar7->desc).offset + lVar8) = uVar13;
            if (uVar13 + 3 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).stored_size + lVar8) =
                   CONCAT13(puVar3[uVar13 + 3],
                            CONCAT12(puVar3[uVar13 + 2],CONCAT11(puVar3[uVar13 + 1],puVar3[uVar13]))
                           );
              uVar18 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).stored_size + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)uVar13);
              uVar18 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 7 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).uncompressed_size + lVar8) =
                   CONCAT13(puVar3[uVar13 + 7],
                            CONCAT12(puVar3[uVar13 + 6],
                                     CONCAT11(puVar3[uVar13 + 5],puVar3[uVar13 + 4])));
              uVar15 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).uncompressed_size + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              uVar15 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0xb < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).virtual_entry + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0xb],
                            CONCAT12(puVar3[uVar13 + 10],
                                     CONCAT11(puVar3[uVar13 + 9],puVar3[uVar13 + 8])));
              uVar12 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).virtual_entry + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              uVar12 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0xf < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).interface_offset + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0xf],
                            CONCAT12(puVar3[uVar13 + 0xe],
                                     CONCAT11(puVar3[uVar13 + 0xd],puVar3[uVar13 + 0xc])));
              local_34 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).interface_offset + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_34 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x13 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).imem_phys_base + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x13],
                            CONCAT12(puVar3[uVar13 + 0x12],
                                     CONCAT11(puVar3[uVar13 + 0x11],puVar3[uVar13 + 0x10])));
              local_38 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).imem_phys_base + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_38 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x17 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).imem_load_size + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x17],
                            CONCAT12(puVar3[uVar13 + 0x16],
                                     CONCAT11(puVar3[uVar13 + 0x15],puVar3[uVar13 + 0x14])));
              local_3c = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).imem_load_size + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_3c = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x1b < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).imem_virt_base + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x1b],
                            CONCAT12(puVar3[uVar13 + 0x1a],
                                     CONCAT11(puVar3[uVar13 + 0x19],puVar3[uVar13 + 0x18])));
              local_40 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).imem_virt_base + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_40 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x1f < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).imem_sec_base + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x1f],
                            CONCAT12(puVar3[uVar13 + 0x1e],
                                     CONCAT11(puVar3[uVar13 + 0x1d],puVar3[uVar13 + 0x1c])));
              uVar20 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).imem_sec_base + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              uVar20 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x23 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).imem_sec_size + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x23],
                            CONCAT12(puVar3[uVar13 + 0x22],
                                     CONCAT11(puVar3[uVar13 + 0x21],puVar3[uVar13 + 0x20])));
              local_44 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).imem_sec_size + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_44 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x27 < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).dmem_offset + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x27],
                            CONCAT12(puVar3[uVar13 + 0x26],
                                     CONCAT11(puVar3[uVar13 + 0x25],puVar3[uVar13 + 0x24])));
              local_48 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).dmem_offset + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              local_48 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x2b < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).dmem_phys_base + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x2b],
                            CONCAT12(puVar3[uVar13 + 0x2a],
                                     CONCAT11(puVar3[uVar13 + 0x29],puVar3[uVar13 + 0x28])));
              uVar16 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).dmem_phys_base + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              uVar16 = 0xfffffff2;
            }
            peVar7 = (bios->p).falcon_ucode.entries;
            if (uVar13 + 0x2f < bios->length) {
              puVar3 = bios->data;
              *(uint *)((long)&(peVar7->desc).dmem_load_size + lVar8) =
                   CONCAT13(puVar3[uVar13 + 0x2f],
                            CONCAT12(puVar3[uVar13 + 0x2e],
                                     CONCAT11(puVar3[uVar13 + 0x2d],puVar3[uVar13 + 0x2c])));
              uVar13 = 0;
            }
            else {
              *(undefined4 *)((long)&(peVar7->desc).dmem_load_size + lVar8) = 0;
              fprintf(_stderr,"requested OOB u32 at 0x%04x\n");
              uVar13 = 0xfffffff2;
            }
            uVar19 = uVar19 | uVar20 | local_44 | local_48 | uVar16 |
                              local_38 | local_3c | local_40 | uVar12 | local_34 | uVar18 | uVar15 |
                              uVar13;
            (&(((bios->p).falcon_ucode.entries)->desc).valid)[lVar8] = uVar19 == 0;
          }
          uVar11 = uVar11 + 1;
          lVar8 = lVar8 + 0x40;
        } while (uVar11 < (bios->p).falcon_ucode.entriesnum);
      }
      iVar17 = 0;
    }
    else {
      fprintf(_stderr,"Unknown FALCON UCODE table version 0x%x\n");
    }
  }
  return iVar17;
}

Assistant:

int
envy_bios_parse_p_falcon_ucode(struct envy_bios *bios)
{
	struct envy_bios_p_falcon_ucode *falcon_ucode = &bios->p.falcon_ucode;
	int i, err = 0;

	if (!falcon_ucode->offset)
		return -EINVAL;

	bios_u8(bios, falcon_ucode->offset + 0x0, &falcon_ucode->version);
	switch(falcon_ucode->version) {
	case 0x1:
		err |= bios_u8(bios, falcon_ucode->offset + 0x1, &falcon_ucode->hlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x2, &falcon_ucode->rlen);
		err |= bios_u8(bios, falcon_ucode->offset + 0x3, &falcon_ucode->entriesnum);

		err |= bios_u8(bios, falcon_ucode->offset + 0x4, &falcon_ucode->desc_version);
		err |= bios_u8(bios, falcon_ucode->offset + 0x5, &falcon_ucode->desc_size);
		falcon_ucode->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FALCON UCODE table version 0x%x\n", falcon_ucode->version);
		return -EINVAL;
	};

	err = 0;
	falcon_ucode->entries = malloc(falcon_ucode->entriesnum * sizeof(struct envy_bios_p_falcon_ucode_entry));
	for (i = 0; i < falcon_ucode->entriesnum; i++) {
		uint32_t data = falcon_ucode->offset + falcon_ucode->hlen + i * falcon_ucode->rlen;

		falcon_ucode->entries[i].offset = data;
		err |= bios_u8(bios, data + 0x0, &falcon_ucode->entries[i].application_id);
		err |= bios_u8(bios, data + 0x1, &falcon_ucode->entries[i].target_id);
		err |= bios_u32(bios, data + 0x2, &falcon_ucode->entries[i].desc_ptr);

		if (falcon_ucode->entries[i].desc_ptr) {
			uint32_t suboffset = falcon_ucode->entries[i].desc_ptr;

			falcon_ucode->entries[i].desc.offset = suboffset;
			err |= bios_u32(bios, suboffset + 0x0, &falcon_ucode->entries[i].desc.stored_size);
			err |= bios_u32(bios, suboffset + 0x4, &falcon_ucode->entries[i].desc.uncompressed_size);
			err |= bios_u32(bios, suboffset + 0x8, &falcon_ucode->entries[i].desc.virtual_entry);
			err |= bios_u32(bios, suboffset + 0xc, &falcon_ucode->entries[i].desc.interface_offset);
			err |= bios_u32(bios, suboffset + 0x10, &falcon_ucode->entries[i].desc.imem_phys_base);
			err |= bios_u32(bios, suboffset + 0x14, &falcon_ucode->entries[i].desc.imem_load_size);
			err |= bios_u32(bios, suboffset + 0x18, &falcon_ucode->entries[i].desc.imem_virt_base);
			err |= bios_u32(bios, suboffset + 0x1c, &falcon_ucode->entries[i].desc.imem_sec_base);
			err |= bios_u32(bios, suboffset + 0x20, &falcon_ucode->entries[i].desc.imem_sec_size);
			err |= bios_u32(bios, suboffset + 0x24, &falcon_ucode->entries[i].desc.dmem_offset);
			err |= bios_u32(bios, suboffset + 0x28, &falcon_ucode->entries[i].desc.dmem_phys_base);
			err |= bios_u32(bios, suboffset + 0x2c, &falcon_ucode->entries[i].desc.dmem_load_size);
			falcon_ucode->entries[i].desc.valid = !err;
		}
	}

	return 0;
}